

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_opencl.cpp
# Opt level: O0

bool basisu::opencl_refine_endpoint_clusterization
               (opencl_context_ptr pContext,cl_block_info_struct *pPixel_block_info,
               uint32_t total_clusters,cl_endpoint_cluster_struct *pCluster_info,
               uint32_t *pSorted_block_indices,uint32_t *pOutput_cluster_indices,bool perceptual)

{
  bool perceptual_local;
  uint32_t *pOutput_cluster_indices_local;
  uint32_t *pSorted_block_indices_local;
  cl_endpoint_cluster_struct *pCluster_info_local;
  uint32_t total_clusters_local;
  cl_block_info_struct *pPixel_block_info_local;
  opencl_context_ptr pContext_local;
  
  return false;
}

Assistant:

bool opencl_refine_endpoint_clusterization(
		opencl_context_ptr pContext,
		const cl_block_info_struct* pPixel_block_info,
		uint32_t total_clusters,
		const cl_endpoint_cluster_struct* pCluster_info,
		const uint32_t* pSorted_block_indices,
		uint32_t* pOutput_cluster_indices,
		bool perceptual)
	{
		BASISU_NOTE_UNUSED(pContext);
		BASISU_NOTE_UNUSED(pPixel_block_info);
		BASISU_NOTE_UNUSED(total_clusters);
		BASISU_NOTE_UNUSED(pCluster_info);
		BASISU_NOTE_UNUSED(pSorted_block_indices);
		BASISU_NOTE_UNUSED(pOutput_cluster_indices);
		BASISU_NOTE_UNUSED(perceptual);

		return false;
	}